

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O3

void deqp::gles3::Performance::writeLoopWorkload
               (ostringstream *stream,char *resultName,char *operandName)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  iVar1 = (int)stream;
  if (resultName == (char *)0x0) {
    std::ios::clear(iVar1 + (int)(stream->super_basic_ostream<char,_std::char_traits<char>_>).
                                 _vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(resultName);
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,resultName,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&stream->super_basic_ostream<char,_std::char_traits<char>_>," = ",3);
  iVar3 = 8;
  do {
    if (iVar3 != 8) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>," * ",3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,"(",1);
    if (resultName == (char *)0x0) {
      std::ios::clear(iVar1 + (int)(stream->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar2 = strlen(resultName);
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,resultName,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>," + ",3);
    if (operandName == (char *)0x0) {
      std::ios::clear(iVar1 + (int)(stream->super_basic_ostream<char,_std::char_traits<char>_>).
                                   _vptr_basic_ostream[-3]);
    }
    else {
      sVar2 = strlen(operandName);
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,operandName,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,")",1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&stream->super_basic_ostream<char,_std::char_traits<char>_>,";",1);
  return;
}

Assistant:

static void writeLoopWorkload (std::ostringstream& stream, const char* resultName, const char* operandName)
{
	const int numMultiplications = 8;

	stream << resultName << " = ";

	for (int i = 0; i < numMultiplications; i++)
	{
		if (i > 0)
			stream << " * ";

		stream << "(" << resultName << " + " << operandName << ")";
	}

	stream << ";";
}